

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libspirv.cpp
# Opt level: O0

bool __thiscall
spvtools::SpirvTools::Disassemble
          (SpirvTools *this,uint32_t *binary,size_t binary_size,string *text,uint32_t options)

{
  spv_result_t sVar1;
  pointer pIVar2;
  spv_text psStack_38;
  spv_result_t status;
  spv_text spvtext;
  string *psStack_28;
  uint32_t options_local;
  string *text_local;
  size_t binary_size_local;
  uint32_t *binary_local;
  SpirvTools *this_local;
  
  psStack_38 = (spv_text)0x0;
  spvtext._4_4_ = options;
  psStack_28 = text;
  text_local = (string *)binary_size;
  binary_size_local = (size_t)binary;
  binary_local = (uint32_t *)this;
  pIVar2 = std::
           unique_ptr<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
           ::operator->(&this->impl_);
  sVar1 = spvBinaryToText(pIVar2->context,(uint32_t *)binary_size_local,(size_t)text_local,
                          spvtext._4_4_,&stack0xffffffffffffffc8,(spv_diagnostic *)0x0);
  if ((sVar1 == SPV_SUCCESS) && ((spvtext._4_4_ & 2) == 0)) {
    if (psStack_38 == (spv_text)0x0) {
      __assert_fail("spvtext",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/libspirv.cpp"
                    ,0x68,
                    "bool spvtools::SpirvTools::Disassemble(const uint32_t *, const size_t, std::string *, uint32_t) const"
                   );
    }
    std::__cxx11::string::assign<char_const*,void>
              ((string *)psStack_28,psStack_38->str,psStack_38->str + psStack_38->length);
  }
  spvTextDestroy(psStack_38);
  return sVar1 == SPV_SUCCESS;
}

Assistant:

bool SpirvTools::Disassemble(const uint32_t* binary, const size_t binary_size,
                             std::string* text, uint32_t options) const {
  spv_text spvtext = nullptr;
  spv_result_t status = spvBinaryToText(impl_->context, binary, binary_size,
                                        options, &spvtext, nullptr);
  if (status == SPV_SUCCESS &&
      (options & SPV_BINARY_TO_TEXT_OPTION_PRINT) == 0) {
    assert(spvtext);
    text->assign(spvtext->str, spvtext->str + spvtext->length);
  }
  spvTextDestroy(spvtext);
  return status == SPV_SUCCESS;
}